

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlValidateOneNamespace(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  Py_ssize_t PVar3;
  Py_ssize_t PVar4;
  Py_ssize_t PVar5;
  Py_ssize_t PVar6;
  xmlChar *value;
  PyObject *pyobj_ns;
  xmlChar *prefix;
  PyObject *pyobj_elem;
  PyObject *pyobj_doc;
  PyObject *pyobj_ctxt;
  
  iVar1 = libxml_deprecationWarning("xmlValidateOneNamespace");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT
                      (args,"OOOzOz:xmlValidateOneNamespace",&pyobj_ctxt,&pyobj_doc,&pyobj_elem,
                       &prefix,&pyobj_ns,&value);
    if (iVar1 != 0) {
      if (pyobj_ctxt == (PyObject *)&_Py_NoneStruct) {
        PVar5 = 0;
      }
      else {
        PVar5 = pyobj_ctxt[1].ob_refcnt;
      }
      if (pyobj_doc == (PyObject *)&_Py_NoneStruct) {
        PVar4 = 0;
      }
      else {
        PVar4 = pyobj_doc[1].ob_refcnt;
      }
      if (pyobj_elem == (PyObject *)&_Py_NoneStruct) {
        PVar3 = 0;
      }
      else {
        PVar3 = pyobj_elem[1].ob_refcnt;
      }
      if (pyobj_ns == (PyObject *)&_Py_NoneStruct) {
        PVar6 = 0;
      }
      else {
        PVar6 = pyobj_ns[1].ob_refcnt;
      }
      iVar1 = xmlValidateOneNamespace(PVar5,PVar4,PVar3,prefix,PVar6,value);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidateOneNamespace(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlChar * prefix;
    xmlNsPtr ns;
    PyObject *pyobj_ns;
    xmlChar * value;

    if (libxml_deprecationWarning("xmlValidateOneNamespace") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOzOz:xmlValidateOneNamespace", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &prefix, &pyobj_ns, &value))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);
    ns = (xmlNsPtr) PyxmlNode_Get(pyobj_ns);

    c_retval = xmlValidateOneNamespace(ctxt, doc, elem, prefix, ns, value);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}